

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsGear.cpp
# Opt level: O2

void __thiscall
chrono::ChShaftsGear::IntLoadConstraint_C
          (ChShaftsGear *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,
          double recovery_clamp)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Scalar *pSVar4;
  undefined3 in_register_00000009;
  undefined1 auVar5 [16];
  undefined8 in_XMM1_Qb;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double local_8;
  
  auVar5._8_8_ = 0;
  auVar5._0_8_ = this->ratio;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = ((this->super_ChShaftsCouple).shaft1)->pos - this->phase1;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = ((this->super_ChShaftsCouple).shaft2)->pos - this->phase2;
  auVar5 = vfmsub231sd_fma(auVar8,auVar6,auVar5);
  local_8 = (double)((ulong)(this->avoid_phase_drift & 1) * auVar5._0_8_) * c;
  if (CONCAT31(in_register_00000009,do_clamp) != 0) {
    auVar1._8_8_ = 0x8000000000000000;
    auVar1._0_8_ = 0x8000000000000000;
    auVar2._8_8_ = in_XMM1_Qb;
    auVar2._0_8_ = recovery_clamp;
    auVar5 = vxorpd_avx512vl(auVar2,auVar1);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_8;
    auVar5 = vmaxsd_avx(auVar7,auVar5);
    auVar3._8_8_ = in_XMM1_Qb;
    auVar3._0_8_ = recovery_clamp;
    auVar5 = vminsd_avx(auVar5,auVar3);
    local_8 = auVar5._0_8_;
  }
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,(ulong)off_L)
  ;
  *pSVar4 = local_8 + *pSVar4;
  return;
}

Assistant:

void ChShaftsGear::IntLoadConstraint_C(const unsigned int off_L,  // offset in Qc residual
                                       ChVectorDynamic<>& Qc,     // result: the Qc residual, Qc += c*C
                                       const double c,            // a scaling factor
                                       bool do_clamp,             // apply clamping to c*C?
                                       double recovery_clamp      // value for min/max clamping of c*C
                                       ) {
    double res = this->ratio * (this->shaft1->GetPos() - phase1) + 
                 -1.0        * (this->shaft2->GetPos() - phase2);
    if (!avoid_phase_drift) 
        res = 0;

    double cnstr_violation = c * res;

    if (do_clamp) {
        cnstr_violation = ChMin(ChMax(cnstr_violation, -recovery_clamp), recovery_clamp);
    }

    Qc(off_L) += cnstr_violation;
}